

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::Impl::clearWorkspace(Impl *this)

{
  Orphanage OVar1;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_compiler_c__:1172:3)>
  _kjDefer1172;
  
  SchemaLoader::~SchemaLoader(&(this->workspace).bootstrapLoader);
  kj::Arena::~Arena(&(this->workspace).arena);
  MallocMessageBuilder::~MallocMessageBuilder(&(this->workspace).message);
  MallocMessageBuilder::MallocMessageBuilder(&(this->workspace).message,0x400,GROW_HEURISTICALLY);
  OVar1 = MessageBuilder::getOrphanage((MessageBuilder *)&this->workspace);
  (this->workspace).orphanage = OVar1;
  kj::Arena::Arena(&(this->workspace).arena,0x400);
  SchemaLoader::SchemaLoader(&(this->workspace).bootstrapLoader,&this->super_LazyLoadCallback);
  return;
}

Assistant:

void Compiler::Impl::clearWorkspace() {
  // Make sure we reconstruct the workspace even if destroying it throws an exception.
  KJ_DEFER(kj::ctor(workspace, *this));
  kj::dtor(workspace);
}